

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::GetLocationPath
          (EnumValueDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int local_18 [2];
  
  EnumDescriptor::GetLocationPath(this->type_,output);
  local_18[1] = 2;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18 + 1);
  local_18[0] = (int)(((long)this - (long)this->type_->values_) / 0x30);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,local_18);
  return;
}

Assistant:

void EnumValueDescriptor::GetLocationPath(std::vector<int>* output) const {
  type()->GetLocationPath(output);
  output->push_back(EnumDescriptorProto::kValueFieldNumber);
  output->push_back(index());
}